

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O0

void __thiscall QGridLayout::setRowStretch(QGridLayout *this,int row,int stretch)

{
  QGridLayoutPrivate *pQVar1;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  QGridLayoutPrivate *d;
  
  pQVar1 = d_func((QGridLayout *)0x3361d4);
  QGridLayoutPrivate::setRowStretch
            ((QGridLayoutPrivate *)CONCAT44(in_ESI,in_EDX),(int)((ulong)pQVar1 >> 0x20),(int)pQVar1)
  ;
  (**(code **)(*in_RDI + 0x70))();
  return;
}

Assistant:

void QGridLayout::setRowStretch(int row, int stretch)
{
    Q_D(QGridLayout);
    d->setRowStretch(row, stretch);
    invalidate();
}